

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

float trng::math::detail::inv_GammaP<float>(float a,float p)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float in_XMM0_Db;
  uint extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar11;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  uint in_XMM1_Db;
  float __x;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar13 [16];
  
  __x = a + -1.0;
  fVar5 = lgammaf(a);
  fVar6 = logf(__x);
  fVar7 = expf((fVar6 + -1.0) * __x - fVar5);
  if (a <= 1.0) {
    fVar8 = 1.0 - (a * 0.12 + 0.253) * a;
    if (fVar8 <= p) {
      fVar8 = log1pf(-(p - fVar8) / (1.0 - fVar8));
      uVar4 = 0;
      fVar8 = 1.0 - fVar8;
    }
    else {
      fVar8 = powf(p / fVar8,1.0 / a);
      uVar4 = extraout_XMM0_Db;
    }
  }
  else {
    uVar4 = -(uint)(p < 0.5);
    fVar8 = logf((float)(~uVar4 & (uint)(1.0 - p) | uVar4 & (uint)p));
    fVar8 = fVar8 * -2.0;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    fVar15 = (fVar8 * 0.04481 + 0.99229) * fVar8 + 1.0;
    fVar8 = (fVar8 * 0.27061 + 2.30753) / fVar15 - fVar8;
    if (a < 0.0) {
      fVar9 = sqrtf(a);
      fVar10 = extraout_XMM0_Db_00;
    }
    else {
      fVar9 = SQRT(a);
      fVar10 = 0.0;
    }
    auVar13._0_8_ = (undefined8)DAT_002a95a0;
    auVar13._8_4_ = DAT_002a95a0._4_4_;
    auVar13._12_4_ = (uint)-fVar15 & in_XMM1_Db | ~in_XMM1_Db & (uint)fVar15;
    auVar12._8_8_ = auVar13._8_8_;
    auVar12._0_4_ = (undefined4)DAT_002a95a0;
    auVar12._4_4_ = (uint)-fVar8 & uVar4 | ~uVar4 & (uint)fVar8;
    auVar14._4_4_ = fVar9 * 3.0;
    auVar14._0_4_ = a * 9.0;
    auVar14._8_4_ = in_XMM0_Db * 0.0;
    auVar14._12_4_ = fVar10 * 0.0;
    auVar14 = divps(auVar12,auVar14);
    fVar15 = powf((1.0 - auVar14._0_4_) - auVar14._4_4_,3.0);
    uVar4 = 0;
    fVar8 = 0.001;
    if (0.001 <= fVar15 * a) {
      fVar8 = fVar15 * a;
    }
  }
  iVar2 = 0x17;
  while( true ) {
    if (fVar8 <= 0.0) {
      return 0.0;
    }
    fVar15 = GammaP<float,true>(a,fVar8);
    if (a <= 1.0) {
      fVar10 = logf(fVar8);
      fVar10 = expf((fVar10 * __x - fVar8) - fVar5);
      uVar11 = extraout_XMM0_Db_02;
    }
    else {
      fVar10 = logf(fVar8);
      fVar10 = expf((fVar10 - fVar6) * __x - (fVar8 - __x));
      fVar10 = fVar10 * fVar7;
      uVar11 = extraout_XMM0_Db_01;
    }
    auVar16._4_4_ = fVar15 - p;
    auVar16._0_4_ = __x;
    auVar16._8_4_ = in_XMM0_Dc;
    auVar16._12_4_ = in_XMM0_Dd;
    auVar1._4_4_ = fVar10;
    auVar1._0_4_ = fVar8;
    auVar1._8_4_ = uVar4;
    auVar1._12_4_ = uVar11;
    auVar14 = divps(auVar16,auVar1);
    fVar9 = auVar14._4_4_;
    fVar10 = (auVar14._0_4_ + -1.0) * fVar9;
    fVar15 = 1.0;
    if (fVar10 <= 1.0) {
      fVar15 = fVar10;
    }
    fVar15 = fVar9 / (1.0 - fVar15 * 0.5);
    fVar8 = fVar8 - fVar15;
    fVar8 = (float)((uint)fVar8 & -(uint)(0.0 < fVar8) |
                   ~-(uint)(0.0 < fVar8) & (uint)((fVar15 + fVar8) * 0.5));
    uVar4 = uVar4 | ~uVar4 & (uint)fVar9;
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (ABS(fVar15) < fVar8 * 0.00034526698) break;
    if (bVar3) {
      return fVar8;
    }
  }
  return fVar8;
}

Assistant:

TRNG_CUDA_ENABLE T inv_GammaP(T a, T p) {
        const T eps{sqrt(numeric_limits<T>::epsilon())};
        const T a1{a - 1};
        const T glna{ln_Gamma(a)};
        const T lna1{ln(a1)};
        const T afac{exp(a1 * (lna1 - 1) - glna)};
        T x;
        // initial guess
        if (a > T{1}) {
          const T pp{p < T{1} / T{2} ? p : 1 - p};
          const T t{sqrt(-2 * ln(pp))};
          x = (T{2.30753} + t * T{0.27061}) / (1 + t * (T{0.99229} + t * T{0.04481})) - t;
          x = p < T{1} / T{2} ? -x : x;
          x = utility::max(T{1} / T{1000}, a * pow(1 - 1 / (9 * a) - x / (3 * sqrt(a)), T{3}));
        } else {
          const T t{1 - a * (T{0.253} + a * T{0.12})};
          x = p < t ? pow(p / t, 1 / a) : 1 - ln1p(-(p - t) / (1 - t));
        }
        // refinement by Halley's method
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          if (x <= 0) {
            x = 0;
            break;
          }
          const T err{GammaP<T, true>(a, x) - p};
          T t;
          if (a > 1)
            t = afac * exp(-(x - a1) + a1 * (ln(x) - lna1));
          else
            t = exp(-x + a1 * ln(x) - glna);
          const T u{err / t};
          t = u / (1 - utility::min(T{1}, u * ((a - 1) / x - 1)) / 2);
          x -= t;
          x = x <= 0 ? (x + t) / 2 : x;
          if (abs(t) < eps * x)
            break;
        }
        return x;
      }